

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int readModRM(InternalInstruction *insn)

{
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  EABase EVar4;
  byte local_1b;
  byte local_1a;
  uint8_t reg;
  uint8_t rm;
  uint8_t mod;
  InternalInstruction *insn_local;
  
  if ((insn->consumedModRM & 1U) != 0) {
    return 0;
  }
  iVar3 = consumeByte(insn,&insn->modRM);
  if (iVar3 != 0) {
    return -1;
  }
  insn->consumedModRM = true;
  insn->orgModRM = insn->modRM;
  if ((((insn->firstByte == '\x0f') && (insn->opcodeType == TWOBYTE)) && (0x1f < insn->opcode)) &&
     (insn->opcode < 0x24)) {
    insn->modRM = insn->modRM | 0xc0;
  }
  bVar2 = insn->modRM >> 6;
  uVar1 = insn->registerSize;
  if (uVar1 == '\x02') {
    insn->regBase = MODRM_REG_AX;
    insn->eaRegBase = EA_REG_AX;
  }
  else if (uVar1 == '\x04') {
    insn->regBase = MODRM_REG_EAX;
    insn->eaRegBase = EA_REG_EAX;
  }
  else if (uVar1 == '\b') {
    insn->regBase = MODRM_REG_RAX;
    insn->eaRegBase = EA_REG_RAX;
  }
  local_1b = (byte)((insn->modRM & 0x38) >> 3) | (byte)(((int)(insn->rexPrefix & 4) >> 2) << 3);
  local_1a = insn->modRM & 7 | (insn->rexPrefix & 1) << 3;
  if (insn->vectorExtensionType == TYPE_EVEX) {
    local_1b = local_1b |
               (byte)(((int)((insn->vectorExtensionPrefix[1] ^ 0xffffffff) & 0x10) >> 4) << 4);
    local_1a = local_1a |
               (byte)(((int)((insn->vectorExtensionPrefix[1] ^ 0xffffffff) & 0x40) >> 6) << 4);
  }
  insn->reg = insn->regBase + (uint)local_1b;
  uVar1 = insn->addressSize;
  if (uVar1 == '\x02') {
    insn->eaBaseBase = EA_BASE_BX_SI;
    switch(bVar2) {
    case 0:
      goto switchD_002002d3_caseD_0;
    case 1:
      insn->eaBase = insn->eaBaseBase + (uint)local_1a;
      insn->eaDisplacement = EA_DISP_8;
      insn->displacementSize = '\x01';
      iVar3 = readDisplacement(insn);
      if (iVar3 == 0) {
        return 0;
      }
      return -1;
    case 2:
      insn->eaBase = insn->eaBaseBase + (uint)local_1a;
      insn->eaDisplacement = EA_DISP_16;
      iVar3 = readDisplacement(insn);
      if (iVar3 == 0) {
        return 0;
      }
      return -1;
    case 3:
      insn->eaBase = insn->eaRegBase + (uint)local_1a;
      iVar3 = readDisplacement(insn);
      if (iVar3 == 0) {
        return 0;
      }
      return -1;
    default:
      return 0;
    }
  }
  if ((uVar1 != '\x04') && (uVar1 != '\b')) {
    return 0;
  }
  insn->eaBaseBase = (uint)(insn->addressSize != '\x04') * 0x10 + EA_BASE_EAX;
  switch(bVar2) {
  case 0:
    insn->eaDisplacement = EA_DISP_NONE;
    if (local_1a != 4) {
      if (local_1a == 5) {
LAB_002004ed:
        insn->eaBase = EA_BASE_NONE;
        insn->eaDisplacement = EA_DISP_32;
        iVar3 = readDisplacement(insn);
        if (iVar3 == 0) {
          return 0;
        }
        return -1;
      }
      if (local_1a != 0xc) {
        if (local_1a == 0xd) goto LAB_002004ed;
        if (local_1a != 0x14) {
          insn->eaBase = insn->eaBaseBase + (uint)local_1a;
          return 0;
        }
      }
    }
    EVar4 = EA_BASE_sib64;
    if (insn->addressSize == '\x04') {
      EVar4 = EA_BASE_sib;
    }
    insn->eaBase = EVar4;
    iVar3 = readSIB(insn);
    if ((iVar3 != 0) || (iVar3 = readDisplacement(insn), iVar3 != 0)) {
      return -1;
    }
    break;
  case 1:
    insn->displacementSize = '\x01';
  case 2:
    insn->eaDisplacement = (bVar2 != 1) + 1 + (uint)(bVar2 != 1);
    if (((local_1a == 4) || (local_1a == 0xc)) || (local_1a == 0x14)) {
      insn->eaBase = EA_BASE_sib;
      iVar3 = readSIB(insn);
      if ((iVar3 != 0) || (iVar3 = readDisplacement(insn), iVar3 != 0)) {
        return -1;
      }
    }
    else {
      insn->eaBase = insn->eaBaseBase + (uint)local_1a;
      iVar3 = readDisplacement(insn);
      if (iVar3 != 0) {
        return -1;
      }
    }
    break;
  case 3:
    insn->eaDisplacement = EA_DISP_NONE;
    insn->eaBase = insn->eaRegBase + (uint)local_1a;
  }
  return 0;
switchD_002002d3_caseD_0:
  if (local_1a != 6) {
    insn->eaBase = insn->eaBaseBase + (uint)local_1a;
    insn->eaDisplacement = EA_DISP_NONE;
    return 0;
  }
  insn->eaBase = EA_BASE_NONE;
  insn->eaDisplacement = EA_DISP_16;
  iVar3 = readDisplacement(insn);
  if (iVar3 == 0) {
    return 0;
  }
  return -1;
}

Assistant:

static int readModRM(struct InternalInstruction *insn)
{
	uint8_t mod, rm, reg;

	// dbgprintf(insn, "readModRM()");

	// already got ModRM byte?
	if (insn->consumedModRM)
		return 0;

	if (consumeByte(insn, &insn->modRM))
		return -1;

	// mark that we already got ModRM
	insn->consumedModRM = true;

	// save original ModRM for later reference
	insn->orgModRM = insn->modRM;

	// handle MOVcr, MOVdr, MOVrc, MOVrd by pretending they have MRM.mod = 3
	if ((insn->firstByte == 0x0f && insn->opcodeType == TWOBYTE) &&
			(insn->opcode >= 0x20 && insn->opcode <= 0x23 ))
		insn->modRM |= 0xC0;

	mod     = modFromModRM(insn->modRM);
	rm      = rmFromModRM(insn->modRM);
	reg     = regFromModRM(insn->modRM);

	/*
	 * This goes by insn->registerSize to pick the correct register, which messes
	 * up if we're using (say) XMM or 8-bit register operands.  That gets fixed in
	 * fixupReg().
	 */
	switch (insn->registerSize) {
		case 2:
			insn->regBase = MODRM_REG_AX;
			insn->eaRegBase = EA_REG_AX;
			break;
		case 4:
			insn->regBase = MODRM_REG_EAX;
			insn->eaRegBase = EA_REG_EAX;
			break;
		case 8:
			insn->regBase = MODRM_REG_RAX;
			insn->eaRegBase = EA_REG_RAX;
			break;
	}

	reg |= rFromREX(insn->rexPrefix) << 3;
	rm  |= bFromREX(insn->rexPrefix) << 3;
	if (insn->vectorExtensionType == TYPE_EVEX) {
		reg |= r2FromEVEX2of4(insn->vectorExtensionPrefix[1]) << 4;
		rm  |=  xFromEVEX2of4(insn->vectorExtensionPrefix[1]) << 4;
	}

	insn->reg = (Reg)(insn->regBase + reg);

	switch (insn->addressSize) {
		case 2:
			insn->eaBaseBase = EA_BASE_BX_SI;

			switch (mod) {
				case 0x0:
					if (rm == 0x6) {
						insn->eaBase = EA_BASE_NONE;
						insn->eaDisplacement = EA_DISP_16;
						if (readDisplacement(insn))
							return -1;
					} else {
						insn->eaBase = (EABase)(insn->eaBaseBase + rm);
						insn->eaDisplacement = EA_DISP_NONE;
					}
					break;
				case 0x1:
					insn->eaBase = (EABase)(insn->eaBaseBase + rm);
					insn->eaDisplacement = EA_DISP_8;
					insn->displacementSize = 1;
					if (readDisplacement(insn))
						return -1;
					break;
				case 0x2:
					insn->eaBase = (EABase)(insn->eaBaseBase + rm);
					insn->eaDisplacement = EA_DISP_16;
					if (readDisplacement(insn))
						return -1;
					break;
				case 0x3:
					insn->eaBase = (EABase)(insn->eaRegBase + rm);
					if (readDisplacement(insn))
						return -1;
					break;
			}
			break;
		case 4:
		case 8:
			insn->eaBaseBase = (insn->addressSize == 4 ? EA_BASE_EAX : EA_BASE_RAX);

			switch (mod) {
				case 0x0:
					insn->eaDisplacement = EA_DISP_NONE; /* readSIB may override this */
					switch (rm) {
						case 0x14:
						case 0x4:
						case 0xc:   /* in case REXW.b is set */
							insn->eaBase = (insn->addressSize == 4 ?
									EA_BASE_sib : EA_BASE_sib64);
							if (readSIB(insn) || readDisplacement(insn))
								return -1;
							break;
						case 0x5:
						case 0xd:
							insn->eaBase = EA_BASE_NONE;
							insn->eaDisplacement = EA_DISP_32;
							if (readDisplacement(insn))
								return -1;
							break;
						default:
							insn->eaBase = (EABase)(insn->eaBaseBase + rm);
							break;
					}

					break;
				case 0x1:
					insn->displacementSize = 1;
					/* FALLTHROUGH */
				case 0x2:
					insn->eaDisplacement = (mod == 0x1 ? EA_DISP_8 : EA_DISP_32);
					switch (rm) {
						case 0x14:
						case 0x4:
						case 0xc:   /* in case REXW.b is set */
							insn->eaBase = EA_BASE_sib;
							if (readSIB(insn) || readDisplacement(insn))
								return -1;
							break;
						default:
							insn->eaBase = (EABase)(insn->eaBaseBase + rm);
							if (readDisplacement(insn))
								return -1;
							break;
					}
					break;
				case 0x3:
					insn->eaDisplacement = EA_DISP_NONE;
					insn->eaBase = (EABase)(insn->eaRegBase + rm);
					break;
			}
			break;
	} /* switch (insn->addressSize) */

	return 0;
}